

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O0

vector<FileStatus,_std::allocator<FileStatus>_> * workStatus(void)

{
  vector<FileStatus,_std::allocator<FileStatus>_> *in_RDI;
  string local_88 [32];
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [8];
  string new_dir;
  vector<FileStatus,_std::allocator<FileStatus>_> *result;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,".",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_45 = 0;
  std::__cxx11::string::string(local_68,local_30);
  std::__cxx11::string::string(local_88,(string *)STAGE_DIR_abi_cxx11_);
  diffStatus(in_RDI,(string *)local_68,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  local_45 = 1;
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

Vector<FileStatus> workStatus(){
    String new_dir = ".";
    Vector<FileStatus> result = diffStatus(new_dir,STAGE_DIR);
    return result;
}